

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_channel.cc
# Opt level: O0

void __thiscall assembler::VirtualChannel::VirtualChannel(VirtualChannel *this,int id)

{
  undefined4 in_ESI;
  undefined4 *in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  
  *in_RDI = in_ESI;
  in_RDI[1] = 0xffffffff;
  std::unique_ptr<assembler::TransportPDU,std::default_delete<assembler::TransportPDU>>::
  unique_ptr<std::default_delete<assembler::TransportPDU>,void>
            ((unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_> *)
             CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)0x13a899)
  ;
  std::
  map<int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>_>
  ::map((map<int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>_>
         *)0x13a8a6);
  return;
}

Assistant:

VirtualChannel::VirtualChannel(int id)
  : id_(id), n_(-1) {
}